

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O3

DOMTreeWalker * __thiscall
xercesc_4_0::DOMDocumentImpl::createTreeWalker
          (DOMDocumentImpl *this,DOMNode *root,ShowType whatToShow,DOMNodeFilter *filter,
          bool entityReferenceExpansion)

{
  int iVar1;
  undefined4 extraout_var;
  DOMException *this_00;
  
  if (root != (DOMNode *)0x0) {
    iVar1 = (*(this->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(this,0x30);
    DOMTreeWalkerImpl::DOMTreeWalkerImpl
              ((DOMTreeWalkerImpl *)CONCAT44(extraout_var,iVar1),root,whatToShow,filter,
               entityReferenceExpansion);
    return &((DOMTreeWalkerImpl *)CONCAT44(extraout_var,iVar1))->super_DOMTreeWalker;
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this_00,9,0,this->fMemoryManager);
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

DOMTreeWalker* DOMDocumentImpl::createTreeWalker (
  DOMNode *root,
  DOMNodeFilter::ShowType whatToShow,
  DOMNodeFilter* filter,
  bool entityReferenceExpansion)
{
    if (!root) {
        throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, getMemoryManager());
        return 0;
    }

    return new (this) DOMTreeWalkerImpl(root, whatToShow, filter, entityReferenceExpansion);
}